

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_l2_projection_grad(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *grad)

{
  REF_NODE ref_node_00;
  REF_STATUS RVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  int iVar4;
  double local_2a8;
  double local_298;
  double local_290;
  double local_280;
  double local_278;
  double local_268;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT ref_malloc_init_i;
  REF_STATUS grad_status;
  REF_STATUS vol_status;
  REF_DBL *vol;
  REF_DBL cell_grad [3];
  double local_218;
  REF_DBL cell_vol;
  REF_INT local_208;
  REF_BOOL div_by_zero;
  REF_INT qua_nodes [27];
  REF_INT pri_nodes [27];
  REF_INT tet_nodes [27];
  REF_INT local_b4;
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT group;
  REF_INT cell;
  REF_INT node;
  REF_INT i;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *grad_local;
  REF_DBL *scalar_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x34,
           "ref_recon_l2_projection_grad","malloc vol of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)ref_node_00->max << 3);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x34,
             "ref_recon_l2_projection_grad","malloc vol of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_node_00->max;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        *(undefined8 *)((long)__ptr + (long)ref_private_macro_code_rss * 8) = 0;
      }
      for (group = 0; group < ref_node_00->max; group = group + 1) {
        if (((-1 < group) && (group < ref_node_00->max)) && (-1 < ref_node_00->global[group])) {
          for (cell = 0; cell < 3; cell = cell + 1) {
            grad[cell + group * 3] = 0.0;
          }
        }
      }
      if (ref_grid->twod == 0) {
        nodes[0x1a] = 8;
        _node = ref_grid->cell[8];
        while (nodes[0x1a] < 0x10) {
          for (cell_node = 0; cell_node < _node->max; cell_node = cell_node + 1) {
            RVar1 = ref_cell_nodes(_node,cell_node,tet_nodes + 0x1a);
            if (RVar1 == 0) {
              switch(_node->type) {
              case REF_CELL_EDG:
              case REF_CELL_ED2:
              case REF_CELL_ED3:
              case REF_CELL_TRI:
              case REF_CELL_TR2:
              case REF_CELL_TR3:
              case REF_CELL_QUA:
              case REF_CELL_QU2:
              case REF_CELL_TE2:
              case REF_CELL_PY2:
              case REF_CELL_PR2:
              case REF_CELL_HE2:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x15c,"ref_recon_l2_projection_grad",6,"implement cell type");
                printf("unknown type %d\n",(ulong)_node->type);
                return 6;
              case REF_CELL_TET:
                uVar2 = ref_node_tet_vol(ref_node_00,tet_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,tet_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + tet_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)tet_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)tet_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x7b,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                break;
              case REF_CELL_PYR:
                pri_nodes[0x1a] = tet_nodes[0x1a];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0xc3,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                pri_nodes[0x1a] = tet_nodes[0x1a];
                tet_nodes[0] = nodes[2];
                tet_nodes[1] = nodes[0];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0xd4,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                break;
              case REF_CELL_PRI:
                pri_nodes[0x1a] = tet_nodes[0x1a];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x8e,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                pri_nodes[0x1a] = tet_nodes[0x1a];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x9f,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                pri_nodes[0x1a] = tet_nodes[0x1a];
                tet_nodes[0] = nodes[0];
                tet_nodes[1] = nodes[3];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0xb0,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                break;
              case REF_CELL_HEX:
                qua_nodes[0x1a] = local_b4;
                pri_nodes[0] = nodes[2];
                pri_nodes[2] = nodes[1];
                pri_nodes[3] = nodes[5];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0xef,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                pri_nodes[0x1a] = qua_nodes[0x1a];
                tet_nodes[0] = pri_nodes[3];
                tet_nodes[1] = pri_nodes[2];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x100,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                pri_nodes[0x1a] = qua_nodes[0x1a];
                tet_nodes[0] = pri_nodes[0];
                tet_nodes[1] = pri_nodes[3];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x111,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                qua_nodes[0x1a] = local_b4;
                pri_nodes[0] = nodes[3];
                pri_nodes[2] = nodes[5];
                pri_nodes[3] = nodes[4];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x129,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                pri_nodes[0x1a] = qua_nodes[0x1a];
                tet_nodes[0] = pri_nodes[3];
                tet_nodes[1] = pri_nodes[2];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x13a,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
                pri_nodes[0x1a] = qua_nodes[0x1a];
                tet_nodes[0] = pri_nodes[0];
                tet_nodes[1] = pri_nodes[3];
                uVar2 = ref_node_tet_vol(ref_node_00,pri_nodes + 0x1a,&local_218);
                uVar3 = ref_node_tet_grad_nodes(ref_node_00,pri_nodes + 0x1a,scalar,(REF_DBL *)&vol)
                ;
                if ((uVar2 == 0) && (uVar3 == 0)) {
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    for (cell = 0; cell < 3; cell = cell + 1) {
                      iVar4 = cell + pri_nodes[(long)nodes[0x19] + 0x1a] * 3;
                      grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                    }
                  }
                  for (nodes[0x19] = 0; nodes[0x19] < 4; nodes[0x19] = nodes[0x19] + 1) {
                    *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                         local_218 +
                         *(double *)((long)__ptr + (long)pri_nodes[(long)nodes[0x19] + 0x1a] * 8);
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x14b,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
                }
              }
            }
          }
          nodes[0x1a] = nodes[0x1a] + 1;
          _node = ref_grid->cell[nodes[0x1a]];
        }
      }
      else {
        for (cell_node = 0; cell_node < ref_grid->cell[3]->max; cell_node = cell_node + 1) {
          RVar1 = ref_cell_nodes(ref_grid->cell[3],cell_node,tet_nodes + 0x1a);
          if (RVar1 == 0) {
            uVar2 = ref_node_tri_area(ref_node_00,tet_nodes + 0x1a,&local_218);
            uVar3 = ref_node_tri_grad_nodes(ref_node_00,tet_nodes + 0x1a,scalar,(REF_DBL *)&vol);
            if ((uVar2 == 0) && (uVar3 == 0)) {
              for (nodes[0x19] = 0; nodes[0x19] < 3; nodes[0x19] = nodes[0x19] + 1) {
                for (cell = 0; cell < 3; cell = cell + 1) {
                  iVar4 = cell + tet_nodes[(long)nodes[0x19] + 0x1a] * 3;
                  grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                }
              }
              for (nodes[0x19] = 0; nodes[0x19] < 3; nodes[0x19] = nodes[0x19] + 1) {
                *(double *)((long)__ptr + (long)tet_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                     local_218 +
                     *(double *)((long)__ptr + (long)tet_nodes[(long)nodes[0x19] + 0x1a] * 8);
              }
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x44,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
            }
          }
        }
        for (cell_node = 0; cell_node < ref_grid->cell[6]->max; cell_node = cell_node + 1) {
          RVar1 = ref_cell_nodes(ref_grid->cell[6],cell_node,&local_208);
          if (RVar1 == 0) {
            tet_nodes[0x1a] = local_208;
            uVar2 = ref_node_tri_area(ref_node_00,tet_nodes + 0x1a,&local_218);
            uVar3 = ref_node_tri_grad_nodes(ref_node_00,tet_nodes + 0x1a,scalar,(REF_DBL *)&vol);
            if ((uVar2 == 0) && (uVar3 == 0)) {
              for (nodes[0x19] = 0; nodes[0x19] < 3; nodes[0x19] = nodes[0x19] + 1) {
                for (cell = 0; cell < 3; cell = cell + 1) {
                  iVar4 = cell + tet_nodes[(long)nodes[0x19] + 0x1a] * 3;
                  grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                }
              }
              for (nodes[0x19] = 0; nodes[0x19] < 3; nodes[0x19] = nodes[0x19] + 1) {
                *(double *)((long)__ptr + (long)tet_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                     local_218 +
                     *(double *)((long)__ptr + (long)tet_nodes[(long)nodes[0x19] + 0x1a] * 8);
              }
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x57,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
            }
            tet_nodes[0x1a] = local_208;
            uVar2 = ref_node_tri_area(ref_node_00,tet_nodes + 0x1a,&local_218);
            uVar3 = ref_node_tri_grad_nodes(ref_node_00,tet_nodes + 0x1a,scalar,(REF_DBL *)&vol);
            if ((uVar2 == 0) && (uVar3 == 0)) {
              for (nodes[0x19] = 0; nodes[0x19] < 3; nodes[0x19] = nodes[0x19] + 1) {
                for (cell = 0; cell < 3; cell = cell + 1) {
                  iVar4 = cell + tet_nodes[(long)nodes[0x19] + 0x1a] * 3;
                  grad[iVar4] = local_218 * cell_grad[(long)cell + -1] + grad[iVar4];
                }
              }
              for (nodes[0x19] = 0; nodes[0x19] < 3; nodes[0x19] = nodes[0x19] + 1) {
                *(double *)((long)__ptr + (long)tet_nodes[(long)nodes[0x19] + 0x1a] * 8) =
                     local_218 +
                     *(double *)((long)__ptr + (long)tet_nodes[(long)nodes[0x19] + 0x1a] * 8);
              }
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x67,"ref_recon_l2_projection_grad",(ulong)uVar2,(ulong)uVar3);
            }
          }
        }
      }
      cell_vol._4_4_ = 0;
      for (group = 0; group < ref_node_00->max; group = group + 1) {
        if (((-1 < group) && (group < ref_node_00->max)) && (-1 < ref_node_00->global[group])) {
          if (*(double *)((long)__ptr + (long)group * 8) * 1e+20 <= 0.0) {
            local_268 = -(*(double *)((long)__ptr + (long)group * 8) * 1e+20);
          }
          else {
            local_268 = *(double *)((long)__ptr + (long)group * 8) * 1e+20;
          }
          if (grad[group * 3] <= 0.0) {
            local_278 = -grad[group * 3];
          }
          else {
            local_278 = grad[group * 3];
          }
          if (local_278 < local_268) {
            if (*(double *)((long)__ptr + (long)group * 8) * 1e+20 <= 0.0) {
              local_280 = -(*(double *)((long)__ptr + (long)group * 8) * 1e+20);
            }
            else {
              local_280 = *(double *)((long)__ptr + (long)group * 8) * 1e+20;
            }
            if (grad[group * 3 + 1] <= 0.0) {
              local_290 = -grad[group * 3 + 1];
            }
            else {
              local_290 = grad[group * 3 + 1];
            }
            if (local_290 < local_280) {
              if (*(double *)((long)__ptr + (long)group * 8) * 1e+20 <= 0.0) {
                local_298 = -(*(double *)((long)__ptr + (long)group * 8) * 1e+20);
              }
              else {
                local_298 = *(double *)((long)__ptr + (long)group * 8) * 1e+20;
              }
              if (grad[group * 3 + 2] <= 0.0) {
                local_2a8 = -grad[group * 3 + 2];
              }
              else {
                local_2a8 = grad[group * 3 + 2];
              }
              if (local_2a8 < local_298) {
                for (cell = 0; cell < 3; cell = cell + 1) {
                  iVar4 = cell + group * 3;
                  grad[iVar4] = grad[iVar4] / *(double *)((long)__ptr + (long)group * 8);
                }
                goto LAB_00208ef3;
              }
            }
          }
          cell_vol._4_4_ = 1;
          for (cell = 0; cell < 3; cell = cell + 1) {
            grad[cell + group * 3] = 0.0;
          }
          printf("%s: %d: %s: total vol %e, ignored\n",
                 *(undefined8 *)((long)__ptr + (long)group * 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x16b,"ref_recon_l2_projection_grad");
        }
LAB_00208ef3:
      }
      ref_grid_local._4_4_ = ref_mpi_all_or(ref_grid->mpi,(REF_BOOL *)((long)&cell_vol + 4));
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_node_ghost_dbl(ref_node_00,grad,3);
        if (ref_grid_local._4_4_ == 0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          ref_grid_local._4_4_ = 0;
          if (cell_vol._4_4_ != 0) {
            ref_grid_local._4_4_ = 4;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x170,"ref_recon_l2_projection_grad",(ulong)ref_grid_local._4_4_,"update ghosts");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x16f,"ref_recon_l2_projection_grad",(ulong)ref_grid_local._4_4_,"mpi all or");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_l2_projection_grad(REF_GRID ref_grid,
                                                REF_DBL *scalar,
                                                REF_DBL *grad) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT i, node, cell, group, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL div_by_zero;
  REF_DBL cell_vol, cell_grad[3];
  REF_DBL *vol;
  REF_STATUS vol_status, grad_status;

  ref_malloc_init(vol, ref_node_max(ref_node), REF_DBL, 0.0);

  each_ref_node_valid_node(ref_node, node) for (i = 0; i < 3; i++)
      grad[i + 3 * node] = 0.0;

  if (ref_grid_twod(ref_grid)) {
    each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
    }
    each_ref_cell_valid_cell_with_nodes(ref_grid_qua(ref_grid), cell,
                                        qua_nodes) {
      nodes[0] = qua_nodes[0];
      nodes[1] = qua_nodes[1];
      nodes[2] = qua_nodes[2];
      nodes[3] = qua_nodes[4];
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
      nodes[0] = qua_nodes[0];
      nodes[1] = qua_nodes[2];
      nodes[2] = qua_nodes[3];
      nodes[3] = qua_nodes[4];
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
    }
  } else {
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        switch (ref_cell_type(ref_cell)) {
          case REF_CELL_TET:
            vol_status = ref_node_tet_vol(ref_node, nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_PRI:
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[4];
            tet_nodes[2] = nodes[5];
            tet_nodes[3] = nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[1];
            tet_nodes[2] = nodes[5];
            tet_nodes[3] = nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[1];
            tet_nodes[2] = nodes[2];
            tet_nodes[3] = nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_PYR:
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[4];
            tet_nodes[2] = nodes[1];
            tet_nodes[3] = nodes[2];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[3];
            tet_nodes[2] = nodes[4];
            tet_nodes[3] = nodes[2];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_HEX:

            pri_nodes[0] = nodes[1];
            pri_nodes[1] = nodes[0];
            pri_nodes[2] = nodes[4];
            pri_nodes[3] = nodes[2];
            pri_nodes[4] = nodes[3];
            pri_nodes[5] = nodes[7];

            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[4];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[2];
            tet_nodes[3] = pri_nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }

            pri_nodes[0] = nodes[1];
            pri_nodes[1] = nodes[4];
            pri_nodes[2] = nodes[5];
            pri_nodes[3] = nodes[2];
            pri_nodes[4] = nodes[7];
            pri_nodes[5] = nodes[6];

            tet_nodes[1] = pri_nodes[4];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[2];
            tet_nodes[3] = pri_nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }

            break;
          case REF_CELL_EDG:
          case REF_CELL_ED2:
          case REF_CELL_ED3:
          case REF_CELL_TRI:
          case REF_CELL_TR2:
          case REF_CELL_TR3:
          case REF_CELL_QUA:
          case REF_CELL_QU2:
          case REF_CELL_TE2:
          case REF_CELL_PY2:
          case REF_CELL_PR2:
          case REF_CELL_HE2:
            RSB(REF_IMPLEMENT, "implement cell type",
                { printf("unknown type %d\n", (int)ref_cell_type(ref_cell)); });
        }
      }
    }
  }

  div_by_zero = REF_FALSE;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_math_divisible(grad[0 + 3 * node], vol[node]) &&
        ref_math_divisible(grad[1 + 3 * node], vol[node]) &&
        ref_math_divisible(grad[2 + 3 * node], vol[node])) {
      for (i = 0; i < 3; i++) grad[i + 3 * node] /= vol[node];
    } else {
      div_by_zero = REF_TRUE;
      for (i = 0; i < 3; i++) grad[i + 3 * node] = 0.0;
      printf("%s: %d: %s: total vol %e, ignored\n", __FILE__, __LINE__,
             __func__, vol[node]);
    }
  }
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &div_by_zero), "mpi all or");
  RSS(ref_node_ghost_dbl(ref_node, grad, 3), "update ghosts");

  ref_free(vol);

  return (div_by_zero ? REF_DIV_ZERO : REF_SUCCESS);
}